

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

void print2Dfield(double **field,int sizeX,int sizeY)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  int j;
  int local_18;
  int local_14;
  
  if (in_RDI == 0) {
    printf("The field is invalid. Please check your input!\n");
  }
  else {
    for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
      for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
        printf("%5g\t",*(undefined8 *)(*(long *)(in_RDI + (long)local_18 * 8) + (long)local_14 * 8))
        ;
      }
      printf("\n");
    }
    printf("\n");
  }
  return;
}

Assistant:

void print2Dfield (REAL** field, int sizeX, int sizeY)
{
	if (field == NULL)
	{
		printf("The field is invalid. Please check your input!\n");
		return;
	}
	for (int j = 0; j < sizeY; j++)
	{
		for (int i = 0; i < sizeX; i++)
		{
			printf("%5g\t",field[i][j]);
		}
		printf("\n");
	}
	printf("\n"); /* Add another empty line for better readability in the output */
	return;
}